

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hh
# Opt level: O2

string * __thiscall
kratos::string::
join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,string *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          begin,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                end,string *sep)

{
  long lVar1;
  stringstream local_1c8 [8];
  stringstream stream;
  
  stream._384_8_ = end._M_current;
  std::__cxx11::stringstream::stringstream(local_1c8);
  for (lVar1 = 0;
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + lVar1) !=
      begin._M_current; lVar1 = lVar1 + 0x20) {
    if (lVar1 != 0) {
      std::operator<<((ostream *)&stream.field_0x8,(string *)stream._384_8_);
    }
    std::operator<<((ostream *)&stream.field_0x8,(string *)(this + lVar1));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return __return_storage_ptr__;
}

Assistant:

std::string static join(Iter begin, Iter end, const std::string &sep) {
    std::stringstream stream;
    for (auto it = begin; it != end; it++) {
        if (it != begin) stream << sep;
        stream << *it;
    }
    return stream.str();
}